

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

Ifn_Ntk_t * Ifn_NtkParse(char *pStr)

{
  word wVar1;
  int iVar2;
  Ifn_Ntk_t *p;
  char *pcVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  p = (Ifn_Ntk_t *)calloc(1,0x3730);
  pcVar3 = pStr;
  do {
    if (*pcVar3 == '\0') {
      iVar2 = Ifn_NtkParseInt(pStr,p);
LAB_00439df8:
      if (iVar2 == 0) {
        if (p != (Ifn_Ntk_t *)0x0) {
          free(p);
        }
        p = (Ifn_Ntk_t *)0x0;
      }
      else {
        Ifn_NtkParseConstraints(pStr,p);
        iVar2 = p->nInps;
        if (0 < (long)iVar2) {
          bVar4 = (char)iVar2 - 6;
          uVar7 = 0;
          uVar6 = (ulong)(uint)(1 << (bVar4 & 0x1f));
          if (iVar2 < 7) {
            uVar6 = 1;
            bVar4 = 0;
          }
          do {
            lVar5 = (long)((int)uVar7 << (bVar4 & 0x1f));
            if (uVar7 < 6) {
              if (0 < (int)uVar6) {
                wVar1 = s_Truths6[uVar7];
                uVar8 = 0;
                do {
                  p->pTtElems[lVar5 + uVar8] = wVar1;
                  uVar8 = uVar8 + 1;
                } while (uVar6 != uVar8);
              }
            }
            else if (0 < (int)uVar6) {
              uVar8 = 0;
              do {
                p->pTtElems[lVar5 + uVar8] =
                     -(ulong)((1 << ((char)uVar7 - 6U & 0x1f) & (uint)uVar8) != 0);
                uVar8 = uVar8 + 1;
              } while (uVar6 != uVar8);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != (long)iVar2);
        }
      }
      return p;
    }
    if (*pcVar3 == '=') {
      iVar2 = Ifn_NtkParseInt2(pStr,p);
      goto LAB_00439df8;
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

Ifn_Ntk_t * Ifn_NtkParse( char * pStr )
{
    Ifn_Ntk_t * p = ABC_CALLOC( Ifn_Ntk_t, 1 );
    if ( Ifn_ManStrType2(pStr) )
    {
        if ( !Ifn_NtkParseInt2( pStr, p ) )
        {
            ABC_FREE( p );
            return NULL;
        }
    }
    else
    {
        if ( !Ifn_NtkParseInt( pStr, p ) )
        {
            ABC_FREE( p );
            return NULL;
        }
    }
    Ifn_NtkParseConstraints( pStr, p );
    Abc_TtElemInit2( p->pTtElems, p->nInps );
//    printf( "Finished parsing: " ); Ifn_NtkPrint(p);
    return p;
}